

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.h
# Opt level: O0

void __thiscall Population::initialize(Population *this)

{
  Clock *pCVar1;
  Logging *pLVar2;
  long in_RDI;
  allocator_type *__a;
  vector<Event_*,_std::allocator<Event_*>_> *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  vector<Event_*,_std::allocator<Event_*>_> *in_stack_ffffffffffffffd0;
  
  __a = (allocator_type *)&stack0xffffffffffffffd7;
  std::allocator<Event_*>::allocator((allocator<Event_*> *)0x1498c3);
  std::vector<Event_*,_std::allocator<Event_*>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (value_type *)in_stack_ffffffffffffffc0,__a);
  std::vector<Event_*,_std::allocator<Event_*>_>::operator=
            (in_stack_ffffffffffffffc0,(vector<Event_*,_std::allocator<Event_*>_> *)__a);
  std::vector<Event_*,_std::allocator<Event_*>_>::~vector(in_stack_ffffffffffffffc0);
  std::allocator<Event_*>::~allocator((allocator<Event_*> *)0x149904);
  pCVar1 = Clock::getInstance();
  *(Clock **)(in_RDI + 0x50) = pCVar1;
  pLVar2 = Logging::getInstance();
  *(Logging **)(in_RDI + 0x58) = pLVar2;
  return;
}

Assistant:

void initialize() {
        output = std::vector<Event*>(numberOfOutputNeurons, NULL);
        clock = Clock::getInstance();
        logger = Logging::getInstance();
    }